

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestInfo *test_info)

{
  char *pcVar1;
  ostream *poVar2;
  TestCase *this_00;
  String local_40;
  
  pcVar1 = (this->original_working_dir_).pathname_.c_str_;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    FilePath::GetCurrentDir();
    String::operator=(&(this->original_working_dir_).pathname_,&local_40);
    String::~String(&local_40);
    pcVar1 = (this->original_working_dir_).pathname_.c_str_;
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      GTestLog::GTestLog((GTestLog *)&local_40,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                         ,0x451);
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Condition !original_working_dir_.IsEmpty() failed. ");
      std::operator<<(poVar2,"Failed to get the current working directory.");
      GTestLog::~GTestLog((GTestLog *)&local_40);
    }
  }
  this_00 = GetTestCase(this,(test_info->impl_->test_case_name_).c_str_,
                        (test_info->impl_->test_case_comment_).c_str_,set_up_tc,tear_down_tc);
  TestCase::AddTestInfo(this_00,test_info);
  return;
}

Assistant:

void AddTestInfo(Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc,
                   TestInfo * test_info) {
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_.Set(FilePath::GetCurrentDir());
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }

    GetTestCase(test_info->test_case_name(),
                test_info->test_case_comment(),
                set_up_tc,
                tear_down_tc)->AddTestInfo(test_info);
  }